

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerCloseWal(Pager *pPager,sqlite3 *db)

{
  int local_20;
  int local_1c;
  int logexists;
  int rc;
  sqlite3 *db_local;
  Pager *pPager_local;
  
  local_1c = 0;
  _logexists = db;
  db_local = (sqlite3 *)pPager;
  if (pPager->pWal == (Wal *)0x0) {
    local_20 = 0;
    local_1c = pagerLockDb(pPager,1);
    if (local_1c == 0) {
      local_1c = sqlite3OsAccess(db_local->pVfs,(char *)db_local->pUpdateArg,0,&local_20);
    }
    if ((local_1c == 0) && (local_20 != 0)) {
      local_1c = pagerOpenWal((Pager *)db_local);
    }
  }
  if (((local_1c == 0) && (db_local->xRollbackCallback != (_func_void_void_ptr *)0x0)) &&
     (local_1c = pagerExclusiveLock((Pager *)db_local), local_1c == 0)) {
    local_1c = sqlite3WalClose((Wal *)db_local->xRollbackCallback,_logexists,
                               (uint)*(byte *)((long)&db_local->pVdbe + 7),
                               (int)(db_local->init).azInit,(u8 *)db_local->xCommitCallback);
    db_local->xRollbackCallback = (_func_void_void_ptr *)0x0;
    pagerFixMaplimit((Pager *)db_local);
    if ((local_1c != 0) && (*(char *)&db_local->pVdbe == '\0')) {
      pagerUnlockDb((Pager *)db_local,1);
    }
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCloseWal(Pager *pPager, sqlite3 *db){
  int rc = SQLITE_OK;

  assert( pPager->journalMode==PAGER_JOURNALMODE_WAL );

  /* If the log file is not already open, but does exist in the file-system,
  ** it may need to be checkpointed before the connection can switch to
  ** rollback mode. Open it now so this can happen.
  */
  if( !pPager->pWal ){
    int logexists = 0;
    rc = pagerLockDb(pPager, SHARED_LOCK);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsAccess(
          pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &logexists
      );
    }
    if( rc==SQLITE_OK && logexists ){
      rc = pagerOpenWal(pPager);
    }
  }

  /* Checkpoint and close the log. Because an EXCLUSIVE lock is held on
  ** the database file, the log and log-summary files will be deleted.
  */
  if( rc==SQLITE_OK && pPager->pWal ){
    rc = pagerExclusiveLock(pPager);
    if( rc==SQLITE_OK ){
      rc = sqlite3WalClose(pPager->pWal, db, pPager->walSyncFlags,
                           pPager->pageSize, (u8*)pPager->pTmpSpace);
      pPager->pWal = 0;
      pagerFixMaplimit(pPager);
      if( rc && !pPager->exclusiveMode ) pagerUnlockDb(pPager, SHARED_LOCK);
    }
  }
  return rc;
}